

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

int ncnn::binary_op_scalar_inplace_pack4<ncnn::binary_op_sub_pack4>(Mat *a,float b,Option *opt)

{
  long in_RDI;
  undefined8 uVar1;
  __m128 afVar2;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  __m128 _b;
  int size;
  int channels;
  int h;
  int w;
  binary_op_sub_pack4 op;
  float local_f8 [2];
  float afStack_f0 [3];
  int local_e4;
  int in_stack_ffffffffffffff24;
  Mat *in_stack_ffffffffffffff28;
  float *local_98;
  int local_8c;
  float local_88 [7];
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  binary_op_sub_pack4 local_59 [25];
  float *local_40;
  float local_38 [2];
  float afStack_30 [4];
  float *local_20;
  
  local_60 = *(int *)(in_RDI + 0x2c);
  local_64 = *(int *)(in_RDI + 0x30);
  local_68 = *(int *)(in_RDI + 0x38);
  local_6c = local_60 * local_64;
  for (local_8c = 0; local_8c < local_68; local_8c = local_8c + 1) {
    Mat::channel(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
    local_98 = Mat::operator_cast_to_float_((Mat *)&stack0xffffffffffffff20);
    Mat::~Mat((Mat *)0x605fad);
    for (local_e4 = 0; local_e4 < local_6c; local_e4 = local_e4 + 1) {
      local_40 = local_98;
      local_f8 = *(float (*) [2])local_98;
      uVar1 = *(undefined8 *)(local_98 + 2);
      afStack_f0._0_8_ = uVar1;
      afVar2 = binary_op_sub_pack4::operator()(local_59,(__m128 *)local_f8,(__m128 *)local_88);
      local_f8 = afVar2._0_8_;
      local_20 = local_98;
      *(float (*) [2])local_98 = local_f8;
      *(undefined8 *)(local_98 + 2) = uVar1;
      local_98 = local_98 + 4;
      afStack_f0._0_8_ = uVar1;
      local_38 = local_f8;
      afStack_30._0_8_ = uVar1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar_inplace_pack4(Mat& a, float b, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;

    __m128 _b = _mm_set1_ps((float)b);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        for (int i = 0; i < size; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = op(_p, _b);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
    }

    return 0;
}